

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

qsizetype QtPrivate::indexOf<QString,QAnyStringView>
                    (QList<QString> *vector,QAnyStringView *u,qsizetype from)

{
  ulong uVar1;
  QString *pQVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  qsizetype *pqVar8;
  qsizetype qVar9;
  QAnyStringView QVar10;
  
  uVar1 = (vector->d).size;
  uVar5 = from;
  if (from < 0) {
    uVar5 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar5 = 0;
    }
  }
  qVar9 = -1;
  if (uVar5 < uVar1) {
    pQVar2 = (vector->d).ptr;
    pqVar8 = &pQVar2[uVar5].d.size;
    lVar6 = uVar1 * 0x18 + uVar5 * -0x18;
    lVar3 = 0x18 - (long)(pQVar2 + uVar5);
    do {
      lVar7 = lVar3;
      if (lVar6 == 0) {
        return -1;
      }
      QVar10.m_size = *pqVar8 | 0x8000000000000000;
      QVar10.field_0.m_data =
           ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pqVar8 + -1))->m_data;
      cVar4 = QAnyStringView::equal(QVar10,*u);
      pqVar8 = pqVar8 + 3;
      lVar6 = lVar6 + -0x18;
      lVar3 = lVar7 + -0x18;
    } while (cVar4 == '\0');
    qVar9 = (-((long)&(vector->d).ptr[-1].d.d + lVar7) >> 3) * -0x5555555555555555;
  }
  return qVar9;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}